

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

uint64_t __thiscall BitStreamReader<SpanReader>::Read(BitStreamReader<SpanReader> *this,int nbits)

{
  bool bVar1;
  int iVar2;
  out_of_range *this_00;
  byte bVar3;
  size_t in_RCX;
  uint64_t uVar4;
  int iVar5;
  long in_FS_OFFSET;
  uint8_t obj;
  uint8_t local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)nbits < 0x41) {
    if (nbits == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (this->m_offset == 8) {
          SpanReader::read(this->m_istream,(int)&local_29,(void *)0x1,in_RCX);
          this->m_buffer = local_29;
          this->m_offset = 0;
        }
        iVar5 = this->m_offset;
        iVar2 = 8 - iVar5;
        if (nbits < 8 - iVar5) {
          iVar2 = nbits;
        }
        bVar3 = 8 - (byte)iVar2;
        in_RCX = (size_t)CONCAT31((int3)((uint)iVar5 >> 8),bVar3);
        uVar4 = uVar4 << ((byte)iVar2 & 0x3f) |
                (ulong)((*(int *)&this->m_buffer << ((byte)iVar5 & 0x1f) & 0xffU) >> (bVar3 & 0x1f))
        ;
        this->m_offset = iVar5 + iVar2;
        iVar5 = nbits - iVar2;
        bVar1 = iVar2 <= nbits;
        nbits = iVar5;
      } while (iVar5 != 0 && bVar1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return uVar4;
    }
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"nbits must be between 0 and 64");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Read(int nbits) {
        if (nbits < 0 || nbits > 64) {
            throw std::out_of_range("nbits must be between 0 and 64");
        }

        uint64_t data = 0;
        while (nbits > 0) {
            if (m_offset == 8) {
                m_istream >> m_buffer;
                m_offset = 0;
            }

            int bits = std::min(8 - m_offset, nbits);
            data <<= bits;
            data |= static_cast<uint8_t>(m_buffer << m_offset) >> (8 - bits);
            m_offset += bits;
            nbits -= bits;
        }
        return data;
    }